

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20240722::debugging_internal::ParseCVQualifiers(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ComplexityGuard guard;
  int iVar10;
  
  iVar9 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar9 + 1;
  state->steps = iVar2 + 1;
  bVar5 = false;
  iVar10 = 0;
  if (iVar2 < 0x20000 && iVar9 < 0x100) {
    iVar8 = iVar9 + 2;
    state->recursion_depth = iVar8;
    state->steps = iVar2 + 2;
    if (iVar2 < 0x1ffff && iVar9 < 0xff) {
      pPVar1 = &state->parse_state;
      iVar10 = 0;
      while( true ) {
        iVar9 = pPVar1->mangled_idx;
        iVar2 = pPVar1->out_cur_idx;
        iVar8 = (state->parse_state).prev_name_idx;
        uVar4 = *(undefined4 *)&(state->parse_state).field_0xc;
        bVar5 = ParseOneCharToken(state,'U');
        if (!bVar5) break;
        uVar3 = *(uint *)&(state->parse_state).field_0xc;
        *(uint *)&(state->parse_state).field_0xc = uVar3 & 0x7fffffff;
        bVar5 = ParseSourceName(state);
        if (!bVar5) {
          pPVar1->mangled_idx = iVar9;
          pPVar1->out_cur_idx = iVar2;
          (state->parse_state).prev_name_idx = iVar8;
          *(undefined4 *)&(state->parse_state).field_0xc = uVar4;
          break;
        }
        ParseTemplateArgs(state);
        *(uint *)&(state->parse_state).field_0xc =
             *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar3 & 0x80000000;
        iVar8 = state->recursion_depth;
        iVar9 = state->steps;
        iVar10 = iVar10 + 1;
        state->steps = iVar9 + 1;
        if ((0x100 < iVar8) || (0x1ffff < iVar9)) goto LAB_00103249;
      }
      iVar8 = state->recursion_depth;
    }
LAB_00103249:
    state->recursion_depth = iVar8 + -1;
    bVar6 = ParseOneCharToken(state,'r');
    bVar7 = ParseOneCharToken(state,'V');
    bVar5 = ParseOneCharToken(state,'K');
    bVar5 = bVar5 || (uint)bVar7 + (uint)bVar6 + iVar10 != 0;
    iVar9 = state->recursion_depth + -1;
  }
  state->recursion_depth = iVar9;
  return bVar5;
}

Assistant:

static bool ParseCVQualifiers(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  int num_cv_qualifiers = 0;
  while (ParseExtendedQualifier(state)) ++num_cv_qualifiers;
  num_cv_qualifiers += ParseOneCharToken(state, 'r');
  num_cv_qualifiers += ParseOneCharToken(state, 'V');
  num_cv_qualifiers += ParseOneCharToken(state, 'K');
  return num_cv_qualifiers > 0;
}